

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

int duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<double,int>
              (double input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  int iVar2;
  duckdb *this;
  double dVar3;
  string local_40;
  
  this = (duckdb *)idx;
  bVar1 = Value::IsFinite<double>(input);
  if (((!bVar1) || (input < -2147483648.0)) || (2147483648.0 <= input)) {
    CastExceptionText<double,int>(&local_40,this,input);
    iVar2 = HandleVectorCastError::Operation<int>(&local_40,mask,idx,(VectorTryCastData *)dataptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    dVar3 = nearbyint(input);
    iVar2 = (int)dVar3;
  }
  return iVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}